

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O1

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>_>
::vine_swap(Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>_>
            *this,Index columnIndex1,Index columnIndex2)

{
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>_>
  *pIVar1;
  int iVar2;
  uint uVar3;
  ID_index IVar4;
  Dimension DVar5;
  uint uVar6;
  undefined4 uVar7;
  _Invoker_type p_Var8;
  _Manager_type p_Var9;
  bool bVar10;
  Index IVar11;
  _Invoker_type p_Var12;
  Column_support *__range2;
  _Invoker_type p_Var13;
  bool bVar14;
  long lVar15;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>_>
  *pIVar16;
  long lVar17;
  anon_class_1_0_00000001 local_3c;
  anon_class_1_0_00000001 local_3b;
  anon_class_1_0_00000001 local_3a;
  anon_class_1_0_00000001 local_39;
  anon_class_8_1_e4bd5e45 local_38;
  
  p_Var8 = this[1].deathComp_._M_invoker;
  lVar17 = (ulong)columnIndex1 * 0x40;
  if ((ulong)*(uint *)(p_Var8 + lVar17 + 0x18) == 0xffffffff) {
    bVar10 = false;
  }
  else {
    bVar10 = *(uint *)(p_Var8 + (ulong)*(uint *)(p_Var8 + lVar17 + 0x18) * 0x40 + 0x14) <
             *(uint *)(p_Var8 + lVar17 + 0x14);
  }
  lVar15 = (ulong)columnIndex2 * 0x40;
  if ((ulong)*(uint *)(p_Var8 + lVar15 + 0x18) == 0xffffffff) {
    bVar14 = false;
  }
  else {
    bVar14 = *(uint *)(p_Var8 + (ulong)*(uint *)(p_Var8 + lVar15 + 0x18) * 0x40 + 0x14) <
             *(uint *)(p_Var8 + lVar15 + 0x14);
  }
  p_Var13 = this[1].deathComp_._M_invoker;
  iVar2 = *(int *)(p_Var13 + lVar17 + 0x14);
  p_Var13 = p_Var13 + lVar15 + 0x30;
  p_Var12 = p_Var13;
  if ((bool)(bVar10 & bVar14)) {
    do {
      p_Var12 = *(_Invoker_type *)p_Var12;
      if (p_Var12 == p_Var13) {
        return columnIndex1;
      }
    } while (*(int *)(p_Var12 + 0x10) != iVar2);
    if (p_Var12 != p_Var13) {
      IVar11 = _negative_vine_swap(this,columnIndex1,columnIndex2);
      return IVar11;
    }
  }
  else if (bVar10) {
    do {
      p_Var12 = *(_Invoker_type *)p_Var12;
      if (p_Var12 == p_Var13) {
        return columnIndex1;
      }
    } while (*(int *)(p_Var12 + 0x10) != iVar2);
    if (p_Var12 != p_Var13) {
      pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>_>
                *)(p_Var8 + lVar17);
      uVar3 = *(uint *)(p_Var8 + lVar17 + 0x14);
      pIVar16 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>_>
                 *)(p_Var8 + lVar15);
      local_38.targetColumn = pIVar1;
      bVar10 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<___matrix::Column_types)7,true,false,false,false,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                         (pIVar16,pIVar1,&local_39,&local_38,&local_3a,&local_3b,&local_3c);
      if (bVar10) {
        IVar4 = (pIVar1->super_Chain_column_option).pivot_;
        (pIVar1->super_Chain_column_option).pivot_ = (pIVar16->super_Chain_column_option).pivot_;
        (pIVar16->super_Chain_column_option).pivot_ = IVar4;
        DVar5 = (pIVar1->super_Column_dimension_option).dim_;
        (pIVar1->super_Column_dimension_option).dim_ = (pIVar16->super_Column_dimension_option).dim_
        ;
        (pIVar16->super_Column_dimension_option).dim_ = DVar5;
      }
      uVar6 = (pIVar1->super_Chain_column_option).pivot_;
      columnIndex1 = columnIndex2;
      if (uVar3 != uVar6) {
        p_Var9 = this[2].birthComp_.super__Function_base._M_manager;
        uVar7 = *(undefined4 *)(p_Var9 + (ulong)uVar3 * 4);
        *(undefined4 *)(p_Var9 + (ulong)uVar3 * 4) = *(undefined4 *)(p_Var9 + (ulong)uVar6 * 4);
        *(undefined4 *)(p_Var9 + (ulong)uVar6 * 4) = uVar7;
      }
    }
  }
  else if (bVar14) {
    do {
      p_Var12 = *(_Invoker_type *)p_Var12;
      if (p_Var12 == p_Var13) {
        return columnIndex1;
      }
    } while (*(int *)(p_Var12 + 0x10) != iVar2);
    if (p_Var12 != p_Var13) {
      pIVar1 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>_>
                *)(p_Var8 + lVar15);
      uVar3 = *(uint *)(p_Var8 + lVar15 + 0x14);
      pIVar16 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_false,_false,_true>_>_>
                 *)(p_Var8 + lVar17);
      local_38.targetColumn = pIVar1;
      bVar10 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,false,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<___matrix::Column_types)7,true,false,false,false,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                         (pIVar16,pIVar1,&local_39,&local_38,&local_3a,&local_3b,&local_3c);
      if (bVar10) {
        IVar4 = (pIVar1->super_Chain_column_option).pivot_;
        (pIVar1->super_Chain_column_option).pivot_ = (pIVar16->super_Chain_column_option).pivot_;
        (pIVar16->super_Chain_column_option).pivot_ = IVar4;
        DVar5 = (pIVar1->super_Column_dimension_option).dim_;
        (pIVar1->super_Column_dimension_option).dim_ = (pIVar16->super_Column_dimension_option).dim_
        ;
        (pIVar16->super_Column_dimension_option).dim_ = DVar5;
      }
      uVar6 = (pIVar1->super_Chain_column_option).pivot_;
      if (uVar3 != uVar6) {
        p_Var9 = this[2].birthComp_.super__Function_base._M_manager;
        uVar7 = *(undefined4 *)(p_Var9 + (ulong)uVar3 * 4);
        *(undefined4 *)(p_Var9 + (ulong)uVar3 * 4) = *(undefined4 *)(p_Var9 + (ulong)uVar6 * 4);
        *(undefined4 *)(p_Var9 + (ulong)uVar6 * 4) = uVar7;
      }
    }
  }
  else {
    do {
      p_Var12 = *(_Invoker_type *)p_Var12;
      if (p_Var12 == p_Var13) {
        return columnIndex1;
      }
    } while (*(int *)(p_Var12 + 0x10) != iVar2);
    if (p_Var12 != p_Var13) {
      IVar11 = _positive_vine_swap(this,columnIndex1,columnIndex2);
      return IVar11;
    }
  }
  return columnIndex1;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::vine_swap(Index columnIndex1,
                                                                                                Index columnIndex2)
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    GUDHI_CHECK(CP::are_adjacent(_matrix()->get_pivot(columnIndex1), _matrix()->get_pivot(columnIndex2)),
                std::invalid_argument(
                    "Chain_vine_swap::vine_swap - Columns to be swapped need to be adjacent in the 'real' matrix."));
  }

  const bool col1IsNeg = _is_negative_in_pair(columnIndex1);
  const bool col2IsNeg = _is_negative_in_pair(columnIndex2);

  if (col1IsNeg && col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (col1IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::negative_positive_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _negative_positive_vine_swap(columnIndex1, columnIndex2);
  }

  if (col2IsNeg) {
    if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
        ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

        CP::positive_negative_transpose(pivot1, pivot2);
        CP::swap_positions(pivot1, pivot2);
      }
      return columnIndex1;
    }
    return _positive_negative_vine_swap(columnIndex1, columnIndex2);
  }

  if (_matrix()->is_zero_entry(columnIndex2, _matrix()->get_pivot(columnIndex1))) {
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      ID_index pivot1 = _matrix()->get_pivot(columnIndex1);
      ID_index pivot2 = _matrix()->get_pivot(columnIndex2);

      CP::positive_transpose(pivot1, pivot2);
      CP::swap_positions(pivot1, pivot2);
    }
    return columnIndex1;
  }
  return _positive_vine_swap(columnIndex1, columnIndex2);
}